

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O0

void pfx_table_test(void)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  pfxv_state local_8c;
  undefined1 local_88 [4];
  pfxv_state res;
  pfx_table pfxt;
  pfx_record pfx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfx_table_init((pfx_table *)local_88,(pfx_update_fp)0x0);
  pfxt.lock.__data.__flags = 0x7b;
  pfxt.lock._52_4_ = 0;
  lrtr_ip_str_to_addr("10.10.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xcb,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_88,0x7c,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  validate((pfx_table *)local_88,0x7b,"10.10.0.0",'\x18',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_88,0x7b,"10.10.10.0",'\x14',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_88,0x7b,"10.10.10.0",'\x19',BGP_PFXV_STATE_INVALID);
  validate((pfx_table *)local_88,0x7b,"10.11.10.0",'\x10',BGP_PFXV_STATE_NOT_FOUND);
  lrtr_ip_str_to_addr("10.10.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  pfxt.lock.__data.__flags = 0x7a;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xd6,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,0x7a,"10.10.0.0",'\x12',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("11.10.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  pfxt.lock.__data.__flags = 0x16;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xdc,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,0x16,"11.10.0.0",'\x11',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("2a01:4f8:131::",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  pfxt.lock._52_4_ = 1;
  pfxt.lock.__data.__flags = 0x7c;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe4,"void pfx_table_test(void)");
  }
  iVar2 = pfx_table_validate((pfx_table *)local_88,0x7c,(lrtr_ip_addr *)((long)&pfxt.lock + 0x34),
                             '0',&local_8c);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_validate(&pfxt, 124, &pfx.prefix, 48, &res) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe5,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,0x7c,"2a01:4f8:131::",'0',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_88,0x7c,"2a01:4f8:131:15::",'8',BGP_PFXV_STATE_INVALID);
  iVar2 = lrtr_ip_str_to_addr("1.0.4.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.4.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xea,"void pfx_table_test(void)");
  }
  pfxt.lock.__data.__flags = 0xdb8b;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xee,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,pfxt.lock.__data.__flags,"1.0.4.0",'\x16',BGP_PFXV_STATE_VALID);
  iVar2 = lrtr_ip_str_to_addr("1.8.1.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.1.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf1,"void pfx_table_test(void)");
  }
  pfxt.lock.__data.__flags = 0x95c9;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf5,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,pfxt.lock.__data.__flags,"1.8.1.0",'\x18',BGP_PFXV_STATE_VALID);
  iVar2 = lrtr_ip_str_to_addr("1.8.8.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.8.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf8,"void pfx_table_test(void)");
  }
  pfxt.lock.__data.__flags = 0x95c9;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xfc,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,pfxt.lock.__data.__flags,"1.8.8.0",'\x18',BGP_PFXV_STATE_VALID);
  pfx_table_free((pfx_table *)local_88);
  iVar2 = lrtr_ip_str_to_addr("1.0.65.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.65.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x100,"void pfx_table_test(void)");
  }
  pfxt.lock.__data.__flags = 0x46e0;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x104,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,pfxt.lock.__data.__flags,"1.0.65.0",'\x12',BGP_PFXV_STATE_VALID);
  pfx_table_free((pfx_table *)local_88);
  iVar2 = lrtr_ip_str_to_addr("10.0.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x108,"void pfx_table_test(void)");
  }
  pfxt.lock.__data.__flags = 0x7b;
  iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x10c,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_88,pfxt.lock.__data.__flags,"10.0.0.0",'\x10',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_88,0x7c,"10.0.5.0",'\x18',BGP_PFXV_STATE_INVALID);
  pfx_table_free((pfx_table *)local_88);
  iVar2 = lrtr_ip_str_to_addr("109.105.96.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
  if (iVar2 == 0) {
    pfxt.lock.__data.__flags = 0x7b;
    iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x115,"void pfx_table_test(void)");
    }
    validate((pfx_table *)local_88,0x1c8,"109.105.128.0",'\x14',BGP_PFXV_STATE_NOT_FOUND);
    pfx_table_free((pfx_table *)local_88);
    iVar2 = lrtr_ip_str_to_addr("190.57.224.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
    if (iVar2 != 0) {
      __assert_fail("lrtr_ip_str_to_addr(\"190.57.224.0\", &pfx.prefix) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x119,"void pfx_table_test(void)");
    }
    pfxt.lock.__data.__flags = 0x7b;
    iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x11d,"void pfx_table_test(void)");
    }
    validate((pfx_table *)local_88,0x7b,"190.57.72.0",'\x15',BGP_PFXV_STATE_NOT_FOUND);
    pfx_table_free((pfx_table *)local_88);
    iVar2 = lrtr_ip_str_to_addr("80.253.128.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
    if (iVar2 != 0) {
      __assert_fail("lrtr_ip_str_to_addr(\"80.253.128.0\", &pfx.prefix) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x121,"void pfx_table_test(void)");
    }
    pfxt.lock.__data.__flags = 0x7b;
    iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x125,"void pfx_table_test(void)");
    }
    validate((pfx_table *)local_88,0x7b,"80.253.144.0",'\x14',BGP_PFXV_STATE_INVALID);
    iVar2 = lrtr_ip_str_to_addr("10.10.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
    if (iVar2 != 0) {
      __assert_fail("lrtr_ip_str_to_addr(\"10.10.0.0\", &pfx.prefix) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x128,"void pfx_table_test(void)");
    }
    pfxt.lock.__data.__flags = 0;
    iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,300,"void pfx_table_test(void)");
    }
    validate((pfx_table *)local_88,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
    iVar2 = lrtr_ip_str_to_addr("10.0.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
    if (iVar2 == 0) {
      pfxt.lock.__data.__flags = 6;
      iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x133,"void pfx_table_test(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("10.0.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
      if (iVar2 != 0) {
        __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x135,"void pfx_table_test(void)");
      }
      pfxt.lock.__data.__flags = 5;
      iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x139,"void pfx_table_test(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("10.1.0.0",(lrtr_ip_addr *)((long)&pfxt.lock + 0x34));
      if (iVar2 == 0) {
        pfxt.lock.__data.__flags = 5;
        iVar2 = pfx_table_add((pfx_table *)local_88,(pfx_record *)((long)&pfxt.lock + 0x30));
        if (iVar2 != 0) {
          __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                        ,0x13f,"void pfx_table_test(void)");
        }
        validate((pfx_table *)local_88,0x7b,"10.1.0.0",'\x10',BGP_PFXV_STATE_INVALID);
        pfx_table_free((pfx_table *)local_88);
        printf("%s() successful\n","pfx_table_test");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      __assert_fail("lrtr_ip_str_to_addr(\"10.1.0.0\", &pfx.prefix) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x13b,"void pfx_table_test(void)");
    }
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x12f,"void pfx_table_test(void)");
  }
  __assert_fail("lrtr_ip_str_to_addr(\"109.105.96.0\", &pfx.prefix) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,0x111,"void pfx_table_test(void)");
}

Assistant:

static void pfx_table_test(void)
{
	struct pfx_table pfxt;
	struct pfx_record pfx;
	enum pfxv_state res;

	pfx_table_init(&pfxt, NULL);

	pfx.asn = 123;
	pfx.prefix.ver = LRTR_IPV4;
	lrtr_ip_str_to_addr("10.10.0.0", &pfx.prefix);
	pfx.min_len = 16;
	pfx.max_len = 24;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);

	validate(&pfxt, 123, "10.10.0.0", 16, BGP_PFXV_STATE_VALID);
	validate(&pfxt, 124, "10.10.0.0", 16, BGP_PFXV_STATE_INVALID);
	validate(&pfxt, 123, "10.10.0.0", 24, BGP_PFXV_STATE_VALID);
	validate(&pfxt, 123, "10.10.10.0", 20, BGP_PFXV_STATE_VALID);
	validate(&pfxt, 123, "10.10.10.0", 25, BGP_PFXV_STATE_INVALID);
	validate(&pfxt, 123, "10.11.10.0", 16, BGP_PFXV_STATE_NOT_FOUND);

	lrtr_ip_str_to_addr("10.10.0.0", &pfx.prefix);
	pfx.asn = 122;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 122, "10.10.0.0", 18, BGP_PFXV_STATE_VALID);

	lrtr_ip_str_to_addr("11.10.0.0", &pfx.prefix);
	pfx.asn = 22;
	pfx.min_len = 17;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 22, "11.10.0.0", 17, BGP_PFXV_STATE_VALID);

	lrtr_ip_str_to_addr("2a01:4f8:131::", &pfx.prefix);
	pfx.prefix.ver = LRTR_IPV6;
	pfx.min_len = 48;
	pfx.max_len = 48;
	pfx.asn = 124;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	assert(pfx_table_validate(&pfxt, 124, &pfx.prefix, 48, &res) == PFX_SUCCESS);
	validate(&pfxt, 124, "2a01:4f8:131::", 48, BGP_PFXV_STATE_VALID);

	validate(&pfxt, 124, "2a01:4f8:131:15::", 56, BGP_PFXV_STATE_INVALID);

	assert(lrtr_ip_str_to_addr("1.0.4.0", &pfx.prefix) == 0);
	pfx.min_len = 22;
	pfx.max_len = 22;
	pfx.asn = 56203;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, pfx.asn, "1.0.4.0", pfx.min_len, BGP_PFXV_STATE_VALID);

	assert(lrtr_ip_str_to_addr("1.8.1.0", &pfx.prefix) == 0);
	pfx.min_len = 24;
	pfx.max_len = 24;
	pfx.asn = 38345;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, pfx.asn, "1.8.1.0", pfx.min_len, BGP_PFXV_STATE_VALID);

	assert(lrtr_ip_str_to_addr("1.8.8.0", &pfx.prefix) == 0);
	pfx.min_len = 24;
	pfx.max_len = 24;
	pfx.asn = 38345;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, pfx.asn, "1.8.8.0", pfx.min_len, BGP_PFXV_STATE_VALID);
	pfx_table_free(&pfxt);

	assert(lrtr_ip_str_to_addr("1.0.65.0", &pfx.prefix) == 0);
	pfx.min_len = 18;
	pfx.max_len = 18;
	pfx.asn = 18144;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, pfx.asn, "1.0.65.0", pfx.min_len, BGP_PFXV_STATE_VALID);
	pfx_table_free(&pfxt);

	assert(lrtr_ip_str_to_addr("10.0.0.0", &pfx.prefix) == 0);
	pfx.min_len = 16;
	pfx.max_len = 16;
	pfx.asn = 123;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, pfx.asn, "10.0.0.0", pfx.min_len, BGP_PFXV_STATE_VALID);
	validate(&pfxt, 124, "10.0.5.0", 24, BGP_PFXV_STATE_INVALID);
	pfx_table_free(&pfxt);

	assert(lrtr_ip_str_to_addr("109.105.96.0", &pfx.prefix) == 0);
	pfx.min_len = 19;
	pfx.max_len = 19;
	pfx.asn = 123;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 456, "109.105.128.0", 20, BGP_PFXV_STATE_NOT_FOUND);
	pfx_table_free(&pfxt);

	assert(lrtr_ip_str_to_addr("190.57.224.0", &pfx.prefix) == 0);
	pfx.min_len = 19;
	pfx.max_len = 24;
	pfx.asn = 123;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 123, "190.57.72.0", 21, BGP_PFXV_STATE_NOT_FOUND);
	pfx_table_free(&pfxt);

	assert(lrtr_ip_str_to_addr("80.253.128.0", &pfx.prefix) == 0);
	pfx.min_len = 19;
	pfx.max_len = 19;
	pfx.asn = 123;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 123, "80.253.144.0", 20, BGP_PFXV_STATE_INVALID);

	assert(lrtr_ip_str_to_addr("10.10.0.0", &pfx.prefix) == 0);
	pfx.min_len = 16;
	pfx.max_len = 16;
	pfx.asn = 0;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);
	validate(&pfxt, 123, "10.10.0.0", 16, BGP_PFXV_STATE_INVALID);

	assert(lrtr_ip_str_to_addr("10.0.0.0", &pfx.prefix) == 0);
	pfx.min_len = 8;
	pfx.max_len = 15;
	pfx.asn = 6;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);

	assert(lrtr_ip_str_to_addr("10.0.0.0", &pfx.prefix) == 0);
	pfx.min_len = 8;
	pfx.max_len = 15;
	pfx.asn = 5;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);

	assert(lrtr_ip_str_to_addr("10.1.0.0", &pfx.prefix) == 0);
	pfx.min_len = 16;
	pfx.max_len = 16;
	pfx.asn = 5;
	assert(pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS);

	validate(&pfxt, 123, "10.1.0.0", 16, BGP_PFXV_STATE_INVALID);

	/* cleanup: free record and table */
	pfx_table_free(&pfxt);
	printf("%s() successful\n", __func__);
}